

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O1

StyleSheetContainer * Rml::StyleSheetFactory::GetStyleSheetContainer(String *sheet_name)

{
  StyleSheetContainer *pSVar1;
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  *pTVar2;
  StyleSheetContainer *in_RAX;
  size_t sVar3;
  long lVar4;
  type puVar5;
  pointer __p;
  StyleSheetContainer *pSVar6;
  pointer *__ptr;
  String *sheet_00;
  UniquePtr<const_StyleSheetContainer> sheet;
  StyleSheetContainer *local_18;
  
  pTVar2 = instance;
  sheet_00 = sheet_name;
  local_18 = in_RAX;
  sVar3 = robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::findIdx<std::__cxx11::string>(instance,sheet_name);
  lVar4 = sVar3 * 0x28 + *(long *)pTVar2;
  if (lVar4 == *(long *)(instance + 8)) {
    LoadStyleSheetContainer((StyleSheetFactory *)&stack0xffffffffffffffe8,sheet_00);
    pSVar6 = local_18;
    if (local_18 == (StyleSheetContainer *)0x0) {
      pSVar6 = (StyleSheetContainer *)0x0;
    }
    else {
      puVar5 = robin_hood::detail::
               Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
               ::
               doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::StyleSheetContainer_const,std::default_delete<Rml::StyleSheetContainer_const>>>
                         (instance,sheet_name);
      local_18 = (StyleSheetContainer *)0x0;
      pSVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_Rml::StyleSheetContainer_*,_std::default_delete<const_Rml::StyleSheetContainer>_>
               .super__Head_base<0UL,_const_Rml::StyleSheetContainer_*,_false>._M_head_impl;
      (puVar5->_M_t).
      super___uniq_ptr_impl<const_Rml::StyleSheetContainer,_std::default_delete<const_Rml::StyleSheetContainer>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_Rml::StyleSheetContainer_*,_std::default_delete<const_Rml::StyleSheetContainer>_>
      .super__Head_base<0UL,_const_Rml::StyleSheetContainer_*,_false>._M_head_impl = pSVar6;
      if (pSVar1 != (StyleSheetContainer *)0x0) {
        (*pSVar1->_vptr_StyleSheetContainer[1])();
      }
    }
    if (local_18 != (StyleSheetContainer *)0x0) {
      (*local_18->_vptr_StyleSheetContainer[1])();
    }
  }
  else {
    pSVar6 = *(StyleSheetContainer **)(lVar4 + 0x20);
  }
  return pSVar6;
}

Assistant:

const StyleSheetContainer* StyleSheetFactory::GetStyleSheetContainer(const String& sheet_name)
{
	// Look up the sheet definition in the cache
	auto it = instance->stylesheets.find(sheet_name);
	if (it != instance->stylesheets.end())
		return it->second.get();

	// Don't currently have the sheet, attempt to load it
	UniquePtr<const StyleSheetContainer> sheet = instance->LoadStyleSheetContainer(sheet_name);
	if (!sheet)
		return nullptr;

	const StyleSheetContainer* result = sheet.get();

	// Add it to the cache.
	instance->stylesheets[sheet_name] = std::move(sheet);

	return result;
}